

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

pool_ptr<soul::heart::Expression> __thiscall
soul::heart::Parser::parseVariableExpression(Parser *this,FunctionParseState *state)

{
  bool bVar1;
  Variable *in_RAX;
  Variable *lhs;
  Expression *pEVar2;
  FunctionParseState *in_RDX;
  pool_ptr<soul::heart::Variable> v;
  pool_ptr<soul::heart::Variable> local_28;
  
  local_28.object = in_RAX;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     *)state,(TokenType)0x2a3312);
  if ((bVar1) &&
     (findVariable((Parser *)&stack0xffffffffffffffd8,state,(string *)in_RDX),
     local_28.object != (Variable *)0x0)) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          *)state);
    lhs = pool_ptr<soul::heart::Variable>::operator*(&stack0xffffffffffffffd8);
    pEVar2 = parseSuffixOperators((Parser *)state,in_RDX,&lhs->super_Expression);
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)pEVar2;
    return (pool_ptr<soul::heart::Expression>)(Expression *)this;
  }
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)0x0;
  return (pool_ptr<soul::heart::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<heart::Expression> parseVariableExpression (const FunctionParseState& state)
    {
        if (matches (Token::variableIdentifier))
        {
            if (auto v = findVariable (state, currentStringValue))
            {
                skip();
                return parseSuffixOperators (state, *v);
            }
        }

        return {};
    }